

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<int,int>
               (vector<String,_std::allocator<String>_> *data,int *arg,int *rest)

{
  String *__x;
  FormatArgument local_40;
  int *local_20;
  int *rest_local;
  int *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_20 = rest;
  rest_local = arg;
  arg_local = (int *)data;
  FormatArgument::FormatArgument<int>(&local_40,arg);
  __x = FormatArgument::text(&local_40);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_40);
  expandFormatArguments<int>((vector<String,_std::allocator<String>_> *)arg_local,local_20);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}